

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMElementImpl::getPreviousLogicalSibling(DOMElementImpl *this,DOMNode *n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar2;
  long *local_28;
  DOMNode *parent;
  DOMNode *prev;
  DOMNode *n_local;
  DOMElementImpl *this_local;
  
  iVar1 = (*n->_vptr_DOMNode[9])();
  parent = (DOMNode *)CONCAT44(extraout_var,iVar1);
  if (parent == (DOMNode *)0x0) {
    iVar1 = (*n->_vptr_DOMNode[5])();
    local_28 = (long *)CONCAT44(extraout_var_00,iVar1);
    while( true ) {
      bVar2 = false;
      if (local_28 != (long *)0x0) {
        iVar1 = (**(code **)(*local_28 + 0x20))();
        bVar2 = iVar1 == 5;
      }
      if ((!bVar2) ||
         (parent = (DOMNode *)(**(code **)(*local_28 + 0x48))(), parent != (DOMNode *)0x0)) break;
      local_28 = (long *)(**(code **)(*local_28 + 0x28))();
    }
  }
  return parent;
}

Assistant:

DOMNode* DOMElementImpl::getPreviousLogicalSibling(const DOMNode* n) const
{
    DOMNode* prev = n->getPreviousSibling();
    // If "n" has no previous sibling and its parent is an entity reference node we
    // need to continue the search through the previous siblings of the entity
    // reference as these are logically siblings of the given node.
    if (prev == NULL) {
        DOMNode* parent = n->getParentNode();
        while (parent != NULL && parent->getNodeType() == DOMNode::ENTITY_REFERENCE_NODE) {
            prev = parent->getPreviousSibling();
            if (prev != NULL) {
                break;
            }
            parent = parent->getParentNode();
        }
    }
    return prev;
}